

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseMinTypMaxExpression
          (Parser *this,bitmask<slang::parsing::detail::ExpressionOptions> options)

{
  bool bVar1;
  ExpressionSyntax *typ_00;
  ExpressionSyntax *max_00;
  Token colon1_00;
  Token colon2_00;
  ExpressionSyntax *max;
  Token colon2;
  ExpressionSyntax *typ;
  Token colon1;
  ExpressionSyntax *first;
  Parser *this_local;
  MinTypMaxExpressionSyntax *pMStack_10;
  bitmask<slang::parsing::detail::ExpressionOptions> options_local;
  
  pMStack_10 = (MinTypMaxExpressionSyntax *)parseSubExpression(this,options,0);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Colon);
  if (bVar1) {
    colon1_00 = ParserBase::consume(&this->super_ParserBase);
    typ_00 = parseExpression(this);
    colon2_00 = ParserBase::expect(&this->super_ParserBase,Colon);
    max_00 = parseExpression(this);
    pMStack_10 = slang::syntax::SyntaxFactory::minTypMaxExpression
                           (&this->factory,(ExpressionSyntax *)pMStack_10,colon1_00,typ_00,colon2_00
                            ,max_00);
  }
  return &pMStack_10->super_ExpressionSyntax;
}

Assistant:

ExpressionSyntax& Parser::parseMinTypMaxExpression(bitmask<ExpressionOptions> options) {
    ExpressionSyntax& first = parseSubExpression(options, 0);
    if (!peek(TokenKind::Colon))
        return first;

    auto colon1 = consume();
    auto& typ = parseExpression();
    auto colon2 = expect(TokenKind::Colon);
    auto& max = parseExpression();

    return factory.minTypMaxExpression(first, colon1, typ, colon2, max);
}